

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void CConsole::ConModCommandStatus(IResult *pResult,void *pUser)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  char aBuf [240];
  char acStack_128 [240];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  mem_zero(acStack_128,0xf0);
  lVar2 = *(long *)((long)pUser + 0x28);
  if (lVar2 != 0) {
    iVar3 = 0;
    do {
      if (((*(uint *)(lVar2 + 0x30) & *(uint *)((long)pUser + 0x10)) != 0) &&
         (*(int *)(lVar2 + 8) == 1)) {
        iVar1 = str_length(*(char **)(lVar2 + 0x10));
        if (iVar1 + iVar3 < 0xee) {
          if (0 < iVar3) {
            iVar3 = iVar3 + 2;
            str_append(acStack_128,", ",0xf0);
          }
          str_append(acStack_128,*(char **)(lVar2 + 0x10),0xf0);
          iVar3 = iVar3 + iVar1;
        }
        else {
          (**(code **)(*pUser + 200))(pUser,0,"console",acStack_128,0);
          mem_zero(acStack_128,0xf0);
          str_copy(acStack_128,*(char **)(lVar2 + 0x10),0xf0);
          iVar3 = iVar1;
        }
      }
      lVar2 = *(long *)(lVar2 + 0x28);
    } while (lVar2 != 0);
    if (0 < iVar3) {
      (**(code **)(*pUser + 200))(pUser,0,"console",acStack_128,0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConsole::ConModCommandStatus(IResult *pResult, void *pUser)
{
	CConsole* pConsole = static_cast<CConsole *>(pUser);
	char aBuf[240];
	mem_zero(aBuf, sizeof(aBuf));
	int Used = 0;

	for(CCommand *pCommand = pConsole->m_pFirstCommand; pCommand; pCommand = pCommand->m_pNext)
	{
		if(pCommand->m_Flags&pConsole->m_FlagMask && pCommand->GetAccessLevel() == ACCESS_LEVEL_MOD)
		{
			int Length = str_length(pCommand->m_pName);
			if(Used + Length + 2 < (int)(sizeof(aBuf)))
			{
				if(Used > 0)
				{
					Used += 2;
					str_append(aBuf, ", ", sizeof(aBuf));
				}
				str_append(aBuf, pCommand->m_pName, sizeof(aBuf));
				Used += Length;
			}
			else
			{
				pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
				mem_zero(aBuf, sizeof(aBuf));
				str_copy(aBuf, pCommand->m_pName, sizeof(aBuf));
				Used = Length;
			}
		}
	}
	if(Used > 0)
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
}